

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O0

void Assimp::Bitmap::Save(aiTexture *texture,IOStream *file)

{
  undefined1 local_50 [8];
  DIB dib;
  Header header;
  IOStream *file_local;
  aiTexture *texture_local;
  
  if (file != (IOStream *)0x0) {
    local_50._0_4_ = 0x28;
    local_50._4_4_ = texture->mWidth;
    dib.size = texture->mHeight;
    dib.width._0_2_ = 1;
    dib.width._2_2_ = 0x20;
    dib.height = 0;
    dib._12_4_ = (local_50._4_4_ * 4 + 3U & 0xfffc) * dib.size;
    dib.compression = 0;
    dib.image_size = 0;
    dib.x_resolution = 0;
    dib.y_resolution = 0;
    dib.nb_colors._0_2_ = 0x4d42;
    dib.nb_important_colors = dib._12_4_ + 0x36;
    WriteHeader((Header *)&dib.nb_colors,file);
    WriteDIB((DIB *)local_50,file);
    WriteData(texture,file);
  }
  return;
}

Assistant:

void Bitmap::Save(aiTexture* texture, IOStream* file) {
        if(file != NULL) {
            Header header;
            DIB dib;

            dib.size = DIB::dib_size;
            dib.width = texture->mWidth;
            dib.height = texture->mHeight;
            dib.planes = 1;
            dib.bits_per_pixel = 8 * mBytesPerPixel;
            dib.compression = 0;
            dib.image_size = (((dib.width * mBytesPerPixel) + 3) & 0x0000FFFC) * dib.height;
            dib.x_resolution = 0;
            dib.y_resolution = 0;
            dib.nb_colors = 0;
            dib.nb_important_colors = 0;

            header.type = 0x4D42; // 'BM'
            header.offset = Header::header_size + DIB::dib_size;
            header.size = header.offset + dib.image_size;
            header.reserved1 = 0;
            header.reserved2 = 0;

            WriteHeader(header, file);
            WriteDIB(dib, file);
            WriteData(texture, file);
        }
    }